

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

CompilerMSL * __thiscall
spirv_cross::CompilerMSL::to_qualifiers_glsl_abi_cxx11_(CompilerMSL *this,uint32_t id)

{
  uint uVar1;
  SPIRVariable *pSVar2;
  SPIRType *pSVar3;
  uint32_t in_EDX;
  undefined4 in_register_00000034;
  Compiler *this_00;
  SPIRType *type;
  SPIRVariable *var;
  uint32_t id_local;
  CompilerMSL *this_local;
  string *quals;
  
  this_00 = (Compiler *)CONCAT44(in_register_00000034,id);
  ::std::__cxx11::string::string((string *)this);
  pSVar2 = Compiler::maybe_get<spirv_cross::SPIRVariable>(this_00,in_EDX);
  pSVar3 = Compiler::expression_type(this_00,in_EDX);
  if ((pSVar3->storage == StorageClassWorkgroup) ||
     ((pSVar2 != (SPIRVariable *)0x0 &&
      (uVar1 = (*this_00->_vptr_Compiler[0x1c])(this_00,pSVar2,4), (uVar1 & 1) != 0)))) {
    ::std::__cxx11::string::operator+=((string *)this,"threadgroup ");
  }
  return this;
}

Assistant:

string CompilerMSL::to_qualifiers_glsl(uint32_t id)
{
	string quals;

	auto *var = maybe_get<SPIRVariable>(id);
	auto &type = expression_type(id);

	if (type.storage == StorageClassWorkgroup || (var && variable_decl_is_remapped_storage(*var, StorageClassWorkgroup)))
		quals += "threadgroup ";

	return quals;
}